

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPlot.cpp
# Opt level: O1

void __thiscall SVGChart::StringData::AddItem(StringData *this,char *inString)

{
  iterator __position;
  allocator<char> local_39;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,inString,&local_39);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->mStringData
             ,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_38._M_dataplus._M_p._4_4_,local_38._M_dataplus._M_p._0_4_) !=
      &local_38.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_38._M_dataplus._M_p._4_4_,local_38._M_dataplus._M_p._0_4_),
                    local_38.field_2._M_allocated_capacity + 1);
  }
  local_38._M_dataplus._M_p._0_4_ =
       (float)(((long)(this->mStringData).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->mStringData).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5) - 1);
  __position._M_current =
       (this->mRealPlotData).super__Vector_base<float,_std::allocator<float>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->mRealPlotData).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
              (&this->mRealPlotData,__position,(float *)&local_38);
  }
  else {
    *__position._M_current = local_38._M_dataplus._M_p._0_4_;
    (this->mRealPlotData).super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  return;
}

Assistant:

void StringData::AddItem (const char *inString) {
      mStringData.push_back (inString);
      mRealPlotData.push_back (mStringData.size ()-1);
    }